

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O3

bool QSharedMemory::isKeyTypeSupported(Type type)

{
  bool bVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  anon_class_1_0_00000001 *this;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,type);
  if (iVar2 == 0x101) {
    return false;
  }
  if (iVar2 != 0x100) {
    bVar1 = QSharedMemorySystemV::runtimeSupportCheck();
    return bVar1;
  }
  if (QSharedMemoryPosix::runtimeSupportCheck()::result == '\0') {
    this = (anon_class_1_0_00000001 *)&QSharedMemoryPosix::runtimeSupportCheck()::result;
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      QSharedMemoryPosix::runtimeSupportCheck::result =
           QSharedMemoryPosix::runtimeSupportCheck::anon_class_1_0_00000001::operator()(this);
      __cxa_guard_release(&QSharedMemoryPosix::runtimeSupportCheck()::result);
    }
  }
  return QSharedMemoryPosix::runtimeSupportCheck::result;
}

Assistant:

bool QSharedMemory::isKeyTypeSupported(QNativeIpcKey::Type type)
{
    if (!isIpcSupported(IpcType::SharedMemory, type))
        return false;
    using Variant = decltype(QSharedMemoryPrivate::backend);
    return Variant::staticVisit(type, [](auto ptr) {
        using Impl = std::decay_t<decltype(*ptr)>;
        return Impl::runtimeSupportCheck();
    });
}